

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O0

qreal __thiscall QHexView::cellWidth(QHexView *this)

{
  qreal qVar1;
  QString local_28;
  QHexView *local_10;
  QHexView *this_local;
  
  local_10 = this;
  QString::QString(&local_28," ");
  qVar1 = (qreal)QFontMetricsF::horizontalAdvance((QString *)&this->m_fontmetrics,(int)&local_28);
  QString::~QString(&local_28);
  return qVar1;
}

Assistant:

qreal QHexView::cellWidth() const {
#if QT_VERSION >= QT_VERSION_CHECK(5, 11, 0)
    return m_fontmetrics.horizontalAdvance(" ");
#else
    return m_fontmetrics.width(" ");
#endif
}